

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_local_date_time * mg_local_date_time_make(int64_t seconds,int64_t nanoseconds)

{
  mg_allocator *in_RSI;
  int64_t in_RDI;
  mg_local_date_time *ldt;
  mg_local_date_time *local_8;
  
  local_8 = mg_local_date_time_alloc(in_RSI);
  if (local_8 == (mg_local_date_time *)0x0) {
    local_8 = (mg_local_date_time *)0x0;
  }
  else {
    local_8->seconds = in_RDI;
    local_8->nanoseconds = (int64_t)in_RSI;
  }
  return local_8;
}

Assistant:

mg_local_date_time *mg_local_date_time_make(int64_t seconds,
                                            int64_t nanoseconds) {
  mg_local_date_time *ldt = mg_local_date_time_alloc(&mg_system_allocator);
  if (!ldt) {
    return NULL;
  }
  ldt->seconds = seconds;
  ldt->nanoseconds = nanoseconds;
  return ldt;
}